

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall fmt::print(fmt *this,FILE *f,CStringRef format_str,ArgList args)

{
  MemoryWriter w;
  
  w.super_BasicWriter<char>.buffer_ = &w.buffer_.super_Buffer<char>;
  w.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_00192708;
  w.buffer_.super_Buffer<char>.ptr_ = w.buffer_.data_;
  w.buffer_.super_Buffer<char>.size_ = 0;
  w.buffer_.super_Buffer<char>.capacity_ = 500;
  w.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00192750;
  BasicWriter<char>::write(&w.super_BasicWriter<char>,(int)f,format_str.data_,args.types_);
  fwrite((w.super_BasicWriter<char>.buffer_)->ptr_,(w.super_BasicWriter<char>.buffer_)->size_,1,
         (FILE *)this);
  BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&w);
  return;
}

Assistant:

FMT_FUNC void fmt::print(std::FILE *f, CStringRef format_str, ArgList args) {
  MemoryWriter w;
  w.write(format_str, args);
  std::fwrite(w.data(), w.size(), 1, f);
}